

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

int main(void)

{
  _Head_base<0UL,_tf::Node_*,_false> _Var1;
  FlowBuilder FVar2;
  uint uVar3;
  shared_ptr<MyObserver> observer;
  Taskflow taskflow;
  Executor executor;
  Future<void> local_268;
  undefined1 local_248 [16];
  shared_ptr<tf::WorkerInterface> local_238;
  shared_ptr<MyObserver> local_228;
  Taskflow local_210;
  Executor local_148;
  
  uVar3 = std::thread::hardware_concurrency();
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_148,(ulong)uVar3,&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&local_210);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:40:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:40:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"A",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:41:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:41:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"B",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:42:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:42:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"C",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:43:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:43:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"D",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:44:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:44:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"E",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:45:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:45:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"F",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:46:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:46:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"G",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_268.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_268.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_268.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_268.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_268.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_268.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_268.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:47:20)>
       ::_M_invoke;
  *(code **)&local_268.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/observer.cpp:47:20)>
       ::_M_manager;
  *(undefined1 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_268.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_268.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)local_210.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_268);
  _Var1._M_head_impl =
       ((local_210.super_FlowBuilder._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"H",(allocator<char> *)local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_268);
  tf::Executor::make_observer<MyObserver,char_const(&)[11]>
            ((Executor *)local_248,(char (*) [11])&local_148);
  tf::Executor::run(&local_268,&local_148,&local_210);
  std::future<void>::get(&local_268.super_future<void>);
  tf::Future<void>::~Future(&local_268);
  local_228.super___shared_ptr<MyObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_248._0_8_;
  local_228.super___shared_ptr<MyObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_;
  local_248._0_8_ = 0;
  local_248._8_8_ = 0;
  tf::Executor::remove_observer<MyObserver>(&local_148,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<MyObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 8));
  tf::Taskflow::~Taskflow(&local_210);
  tf::Executor::~Executor(&local_148);
  return 0;
}

Assistant:

int main(){

  tf::Executor executor;

  // Create a taskflow of eight tasks
  tf::Taskflow taskflow;

  taskflow.emplace([] () { std::cout << "1\n"; }).name("A");
  taskflow.emplace([] () { std::cout << "2\n"; }).name("B");
  taskflow.emplace([] () { std::cout << "3\n"; }).name("C");
  taskflow.emplace([] () { std::cout << "4\n"; }).name("D");
  taskflow.emplace([] () { std::cout << "5\n"; }).name("E");
  taskflow.emplace([] () { std::cout << "6\n"; }).name("F");
  taskflow.emplace([] () { std::cout << "7\n"; }).name("G");
  taskflow.emplace([] () { std::cout << "8\n"; }).name("H");

  // create a default observer
  std::shared_ptr<MyObserver> observer = executor.make_observer<MyObserver>("MyObserver");

  // run the taskflow
  executor.run(taskflow).get();

  // remove the observer (optional)
  executor.remove_observer(std::move(observer));

  return 0;
}